

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathCacheWrapNodeSet(xmlXPathContextPtr ctxt,xmlNodeSetPtr val)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  xmlXPathObjectPtr ret;
  xmlXPathContextCachePtr cache;
  xmlNodeSetPtr val_local;
  xmlXPathContextPtr ctxt_local;
  
  if ((((ctxt == (xmlXPathContextPtr)0x0) || (ctxt->cache == (void *)0x0)) ||
      (pvVar1 = ctxt->cache, *(long *)((long)pvVar1 + 0x20) == 0)) ||
     (*(int *)(*(long *)((long)pvVar1 + 0x20) + 8) == 0)) {
    ctxt_local = (xmlXPathContextPtr)xmlXPathWrapNodeSet(val);
  }
  else {
    lVar2 = **(long **)((long)pvVar1 + 0x20);
    iVar3 = *(int *)(*(long *)((long)pvVar1 + 0x20) + 8) + -1;
    *(int *)(*(long *)((long)pvVar1 + 0x20) + 8) = iVar3;
    ctxt_local = *(xmlXPathContextPtr *)(lVar2 + (long)iVar3 * 8);
    *(undefined4 *)&ctxt_local->doc = 1;
    ctxt_local->node = (xmlNodePtr)val;
  }
  return (xmlXPathObjectPtr)ctxt_local;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheWrapNodeSet(xmlXPathContextPtr ctxt, xmlNodeSetPtr val)
{
    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache =
	    (xmlXPathContextCachePtr) ctxt->cache;

	if ((cache->miscObjs != NULL) &&
	    (cache->miscObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->miscObjs->items[--cache->miscObjs->number];
	    ret->type = XPATH_NODESET;
	    ret->nodesetval = val;
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_NODESET);
#endif
	    return(ret);
	}
    }

    return(xmlXPathWrapNodeSet(val));

}